

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

int booster::locale::gnu_gettext::message_key<char>::compare(char_type *l,char_type *r)

{
  bool bVar1;
  char *in_RSI;
  char *in_RDI;
  char_type cr;
  char_type cl;
  char local_1a;
  char local_19;
  char *local_18;
  char *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    local_19 = *local_10;
    local_1a = *local_18;
    if ((local_19 == '\0') && (local_1a == '\0')) {
      return 0;
    }
    local_18 = local_18 + 1;
    local_10 = local_10 + 1;
    bVar1 = std::char_traits<char>::lt(&local_19,&local_1a);
    if (bVar1) {
      return -1;
    }
    bVar1 = std::char_traits<char>::lt(&local_1a,&local_19);
  } while (!bVar1);
  return 1;
}

Assistant:

static int compare(char_type const *l,char_type const *r)
                {
                    typedef std::char_traits<char_type> traits_type;
                    for(;;) {
                        char_type cl = *l++;
                        char_type cr = *r++;
                        if(cl == 0 && cr == 0)
                            return 0;
                        if(traits_type::lt(cl,cr))
                            return -1;
                        if(traits_type::lt(cr,cl))
                            return 1;
                    }
                }